

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderDerivateTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Functional::LinearDerivateCase::init(LinearDerivateCase *this,EVP_PKEY_CTX *ctx)

{
  Precision PVar1;
  int iVar2;
  int extraout_EAX;
  char *pcVar3;
  mapped_type *pmVar4;
  DataType dataType;
  float x_;
  float x__00;
  char *local_400;
  char *local_3f8;
  char *local_3d8;
  char *local_3d0;
  Precision local_364;
  Vector<float,_4> local_334;
  Vector<float,_4> local_324;
  Vector<float,_4> local_314;
  Vector<float,_4> local_304;
  undefined8 local_2f4;
  undefined8 local_2ec;
  undefined8 local_2e4;
  undefined8 local_2dc;
  undefined8 local_2d4;
  undefined8 local_2cc;
  Vector<float,_4> local_2c4;
  Vector<float,_4> local_2b4;
  undefined1 local_2a4 [8];
  Vec4 dy;
  Vector<float,_4> local_284;
  undefined1 local_274 [8];
  Vec4 dx;
  undefined8 local_25c;
  Vector<float,_4> local_254;
  Vector<float,_4> local_244;
  Vector<float,_4> local_234;
  Vector<float,_4> local_224;
  Vector<float,_4> local_214;
  Vector<float,_4> local_204;
  Vector<float,_4> local_1f4;
  allocator<char> local_1e1;
  string local_1e0;
  StringTemplate local_1c0;
  string local_1a0;
  allocator<char> local_179;
  key_type local_178;
  allocator<char> local_151;
  key_type local_150;
  allocator<char> local_129;
  key_type local_128;
  allocator<char> local_101;
  key_type local_100;
  allocator<char> local_d9;
  key_type local_d8;
  allocator<char> local_b1;
  key_type local_b0;
  allocator<char> local_89;
  key_type local_88;
  undefined1 local_58 [8];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  fragmentParams;
  bool packToInt;
  float h;
  float w;
  IVec2 viewportSize;
  LinearDerivateCase *this_local;
  
  viewportSize.m_data = (int  [2])this;
  TriangleDerivateCase::getViewportSize((TriangleDerivateCase *)&h);
  iVar2 = tcu::Vector<int,_2>::x((Vector<int,_2> *)&h);
  x_ = (float)iVar2;
  iVar2 = tcu::Vector<int,_2>::y((Vector<int,_2> *)&h);
  x__00 = (float)iVar2;
  fragmentParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ =
       (this->super_TriangleDerivateCase).m_surfaceType == SURFACETYPE_FLOAT_FBO;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)local_58);
  dataType = TYPE_FLOAT_VEC4;
  if ((fragmentParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) != 0) {
    dataType = TYPE_UINT_VEC4;
  }
  pcVar3 = glu::getDataTypeName(dataType);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_88,"OUTPUT_TYPE",&local_89);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_58,&local_88);
  std::__cxx11::string::operator=((string *)pmVar4,pcVar3);
  std::__cxx11::string::~string((string *)&local_88);
  std::allocator<char>::~allocator(&local_89);
  if ((fragmentParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    local_364 = (this->super_TriangleDerivateCase).m_precision;
  }
  else {
    local_364 = PRECISION_HIGHP;
  }
  pcVar3 = glu::getPrecisionName(local_364);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_b0,"OUTPUT_PREC",&local_b1);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_58,&local_b0);
  std::__cxx11::string::operator=((string *)pmVar4,pcVar3);
  std::__cxx11::string::~string((string *)&local_b0);
  std::allocator<char>::~allocator(&local_b1);
  pcVar3 = glu::getPrecisionName((this->super_TriangleDerivateCase).m_precision);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_d8,"PRECISION",&local_d9);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_58,&local_d8);
  std::__cxx11::string::operator=((string *)pmVar4,pcVar3);
  std::__cxx11::string::~string((string *)&local_d8);
  std::allocator<char>::~allocator(&local_d9);
  pcVar3 = glu::getDataTypeName((this->super_TriangleDerivateCase).m_dataType);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_100,"DATATYPE",&local_101);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_58,&local_100);
  std::__cxx11::string::operator=((string *)pmVar4,pcVar3);
  std::__cxx11::string::~string((string *)&local_100);
  std::allocator<char>::~allocator(&local_101);
  pcVar3 = getDerivateFuncName(*(DerivateFunc *)&(this->super_TriangleDerivateCase).field_0xf4);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_128,"FUNC",&local_129);
  pmVar4 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)local_58,&local_128);
  std::__cxx11::string::operator=((string *)pmVar4,pcVar3);
  std::__cxx11::string::~string((string *)&local_128);
  std::allocator<char>::~allocator(&local_129);
  if ((fragmentParams._M_t._M_impl.super__Rb_tree_header._M_node_count._7_1_ & 1) == 0) {
    if ((this->super_TriangleDerivateCase).m_dataType == TYPE_FLOAT_VEC4) {
      local_3f8 = "res";
    }
    else {
      if ((this->super_TriangleDerivateCase).m_dataType == TYPE_FLOAT_VEC3) {
        local_400 = "vec4(res, 1.0)";
      }
      else {
        local_400 = "vec4(res, 0.0, 0.0, 1.0)";
        if ((this->super_TriangleDerivateCase).m_dataType == TYPE_FLOAT_VEC2) {
          local_400 = "vec4(res, 0.0, 1.0)";
        }
      }
      local_3f8 = local_400;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_178,"CAST_TO_OUTPUT",&local_179);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_58,&local_178);
    std::__cxx11::string::operator=((string *)pmVar4,local_3f8);
    std::__cxx11::string::~string((string *)&local_178);
    std::allocator<char>::~allocator(&local_179);
  }
  else {
    if ((this->super_TriangleDerivateCase).m_dataType == TYPE_FLOAT_VEC4) {
      local_3d0 = "floatBitsToUint(res)";
    }
    else {
      if ((this->super_TriangleDerivateCase).m_dataType == TYPE_FLOAT_VEC3) {
        local_3d8 = "floatBitsToUint(vec4(res, 1.0))";
      }
      else {
        local_3d8 = "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
        if ((this->super_TriangleDerivateCase).m_dataType == TYPE_FLOAT_VEC2) {
          local_3d8 = "floatBitsToUint(vec4(res, 0.0, 1.0))";
        }
      }
      local_3d0 = local_3d8;
    }
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_150,"CAST_TO_OUTPUT",&local_151);
    pmVar4 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                           *)local_58,&local_150);
    std::__cxx11::string::operator=((string *)pmVar4,local_3d0);
    std::__cxx11::string::~string((string *)&local_150);
    std::allocator<char>::~allocator(&local_151);
  }
  pcVar3 = (char *)std::__cxx11::string::c_str();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_1e0,pcVar3,&local_1e1);
  tcu::StringTemplate::StringTemplate(&local_1c0,&local_1e0);
  tcu::StringTemplate::specialize
            (&local_1a0,&local_1c0,
             (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)local_58);
  std::__cxx11::string::operator=
            ((string *)&(this->super_TriangleDerivateCase).m_fragmentSrc,(string *)&local_1a0);
  std::__cxx11::string::~string((string *)&local_1a0);
  tcu::StringTemplate::~StringTemplate(&local_1c0);
  std::__cxx11::string::~string((string *)&local_1e0);
  std::allocator<char>::~allocator(&local_1e1);
  PVar1 = (this->super_TriangleDerivateCase).m_precision;
  if (PVar1 == PRECISION_LOWP) {
    tcu::Vector<float,_4>::Vector(&local_234,0.0,-1.0,0.0,1.0);
    *(undefined8 *)(this->super_TriangleDerivateCase).m_coordMin.m_data = local_234.m_data._0_8_;
    *(undefined8 *)((this->super_TriangleDerivateCase).m_coordMin.m_data + 2) =
         local_234.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_244,1.0,1.0,-1.0,-1.0);
    *(undefined8 *)(this->super_TriangleDerivateCase).m_coordMax.m_data = local_244.m_data._0_8_;
    *(undefined8 *)((this->super_TriangleDerivateCase).m_coordMax.m_data + 2) =
         local_244.m_data._8_8_;
  }
  else if (PVar1 == PRECISION_MEDIUMP) {
    tcu::Vector<float,_4>::Vector(&local_214,-37.0,47.0,-7.0,0.0);
    *(undefined8 *)(this->super_TriangleDerivateCase).m_coordMin.m_data = local_214.m_data._0_8_;
    *(undefined8 *)((this->super_TriangleDerivateCase).m_coordMin.m_data + 2) =
         local_214.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_224,-1.0,12.0,7.0,19.0);
    *(undefined8 *)(this->super_TriangleDerivateCase).m_coordMax.m_data = local_224.m_data._0_8_;
    *(undefined8 *)((this->super_TriangleDerivateCase).m_coordMax.m_data + 2) =
         local_224.m_data._8_8_;
  }
  else if (PVar1 == PRECISION_HIGHP) {
    tcu::Vector<float,_4>::Vector(&local_1f4,-97.0,0.2,71.0,74.0);
    *(undefined8 *)(this->super_TriangleDerivateCase).m_coordMin.m_data = local_1f4.m_data._0_8_;
    *(undefined8 *)((this->super_TriangleDerivateCase).m_coordMin.m_data + 2) =
         local_1f4.m_data._8_8_;
    tcu::Vector<float,_4>::Vector(&local_204,-13.2,-77.0,44.0,76.0);
    *(undefined8 *)(this->super_TriangleDerivateCase).m_coordMax.m_data = local_204.m_data._0_8_;
    *(undefined8 *)((this->super_TriangleDerivateCase).m_coordMax.m_data + 2) =
         local_204.m_data._8_8_;
  }
  if ((this->super_TriangleDerivateCase).m_surfaceType == SURFACETYPE_FLOAT_FBO) {
    tcu::Vector<float,_4>::Vector(&local_254,1.0);
    *(undefined8 *)(this->super_TriangleDerivateCase).m_derivScale.m_data = local_254.m_data._0_8_;
    *(undefined8 *)((this->super_TriangleDerivateCase).m_derivScale.m_data + 2) =
         local_254.m_data._8_8_;
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(dx.m_data + 2),0.0);
    *(undefined8 *)(this->super_TriangleDerivateCase).m_derivBias.m_data = dx.m_data._8_8_;
    *(undefined8 *)((this->super_TriangleDerivateCase).m_derivBias.m_data + 2) = local_25c;
  }
  else {
    tcu::operator-((tcu *)&local_284,&(this->super_TriangleDerivateCase).m_coordMax,
                   &(this->super_TriangleDerivateCase).m_coordMin);
    tcu::Vector<float,_4>::Vector((Vector<float,_4> *)(dy.m_data + 2),x_,x_,x_ * 0.5,-x_ * 0.5);
    tcu::operator/((tcu *)local_274,&local_284,(Vector<float,_4> *)(dy.m_data + 2));
    tcu::operator-((tcu *)&local_2b4,&(this->super_TriangleDerivateCase).m_coordMax,
                   &(this->super_TriangleDerivateCase).m_coordMin);
    tcu::Vector<float,_4>::Vector(&local_2c4,x__00,x__00,x__00 * 0.5,-x__00 * 0.5);
    tcu::operator/((tcu *)local_2a4,&local_2b4,&local_2c4);
    iVar2 = *(int *)&(this->super_TriangleDerivateCase).field_0xf4;
    if (iVar2 == 0) {
      tcu::operator/((tcu *)&local_2d4,0.5,(Vector<float,_4> *)local_274);
      *(undefined8 *)(this->super_TriangleDerivateCase).m_derivScale.m_data = local_2d4;
      *(undefined8 *)((this->super_TriangleDerivateCase).m_derivScale.m_data + 2) = local_2cc;
    }
    else if (iVar2 == 1) {
      tcu::operator/((tcu *)&local_2e4,0.5,(Vector<float,_4> *)local_2a4);
      *(undefined8 *)(this->super_TriangleDerivateCase).m_derivScale.m_data = local_2e4;
      *(undefined8 *)((this->super_TriangleDerivateCase).m_derivScale.m_data + 2) = local_2dc;
    }
    else if (iVar2 == 2) {
      tcu::abs<float,4>((tcu *)&local_314,(Vector<float,_4> *)local_274);
      tcu::abs<float,4>((tcu *)&local_324,(Vector<float,_4> *)local_2a4);
      tcu::operator+((tcu *)&local_304,&local_314,&local_324);
      tcu::operator/((tcu *)&local_2f4,0.5,&local_304);
      *(undefined8 *)(this->super_TriangleDerivateCase).m_derivScale.m_data = local_2f4;
      *(undefined8 *)((this->super_TriangleDerivateCase).m_derivScale.m_data + 2) = local_2ec;
    }
    tcu::Vector<float,_4>::Vector(&local_334,0.0,0.0,0.0,0.0);
    *(undefined8 *)(this->super_TriangleDerivateCase).m_derivBias.m_data = local_334.m_data._0_8_;
    *(undefined8 *)((this->super_TriangleDerivateCase).m_derivBias.m_data + 2) =
         local_334.m_data._8_8_;
  }
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)local_58);
  return extraout_EAX;
}

Assistant:

void LinearDerivateCase::init (void)
{
	const tcu::IVec2	viewportSize	= getViewportSize();
	const float			w				= float(viewportSize.x());
	const float			h				= float(viewportSize.y());
	const bool			packToInt		= m_surfaceType == SURFACETYPE_FLOAT_FBO;
	map<string, string>	fragmentParams;

	fragmentParams["OUTPUT_TYPE"]		= glu::getDataTypeName(packToInt ? glu::TYPE_UINT_VEC4 : glu::TYPE_FLOAT_VEC4);
	fragmentParams["OUTPUT_PREC"]		= glu::getPrecisionName(packToInt ? glu::PRECISION_HIGHP : m_precision);
	fragmentParams["PRECISION"]			= glu::getPrecisionName(m_precision);
	fragmentParams["DATATYPE"]			= glu::getDataTypeName(m_dataType);
	fragmentParams["FUNC"]				= getDerivateFuncName(m_func);

	if (packToInt)
	{
		fragmentParams["CAST_TO_OUTPUT"]	= m_dataType == glu::TYPE_FLOAT_VEC4 ? "floatBitsToUint(res)" :
											  m_dataType == glu::TYPE_FLOAT_VEC3 ? "floatBitsToUint(vec4(res, 1.0))" :
											  m_dataType == glu::TYPE_FLOAT_VEC2 ? "floatBitsToUint(vec4(res, 0.0, 1.0))" :
											  /* TYPE_FLOAT */					   "floatBitsToUint(vec4(res, 0.0, 0.0, 1.0))";
	}
	else
	{
		fragmentParams["CAST_TO_OUTPUT"]	= m_dataType == glu::TYPE_FLOAT_VEC4 ? "res" :
											  m_dataType == glu::TYPE_FLOAT_VEC3 ? "vec4(res, 1.0)" :
											  m_dataType == glu::TYPE_FLOAT_VEC2 ? "vec4(res, 0.0, 1.0)" :
											  /* TYPE_FLOAT */					   "vec4(res, 0.0, 0.0, 1.0)";
	}

	m_fragmentSrc = tcu::StringTemplate(m_fragmentTmpl.c_str()).specialize(fragmentParams);

	switch (m_precision)
	{
		case glu::PRECISION_HIGHP:
			m_coordMin = tcu::Vec4(-97.f, 0.2f, 71.f, 74.f);
			m_coordMax = tcu::Vec4(-13.2f, -77.f, 44.f, 76.f);
			break;

		case glu::PRECISION_MEDIUMP:
			m_coordMin = tcu::Vec4(-37.0f, 47.f, -7.f, 0.0f);
			m_coordMax = tcu::Vec4(-1.0f, 12.f, 7.f, 19.f);
			break;

		case glu::PRECISION_LOWP:
			m_coordMin = tcu::Vec4(0.0f, -1.0f, 0.0f, 1.0f);
			m_coordMax = tcu::Vec4(1.0f, 1.0f, -1.0f, -1.0f);
			break;

		default:
			DE_ASSERT(false);
	}

	if (m_surfaceType == SURFACETYPE_FLOAT_FBO)
	{
		// No scale or bias used for accuracy.
		m_derivScale	= tcu::Vec4(1.0f);
		m_derivBias		= tcu::Vec4(0.0f);
	}
	else
	{
		// Compute scale - bias that normalizes to 0..1 range.
		const tcu::Vec4 dx = (m_coordMax - m_coordMin) / tcu::Vec4(w, w, w*0.5f, -w*0.5f);
		const tcu::Vec4 dy = (m_coordMax - m_coordMin) / tcu::Vec4(h, h, h*0.5f, -h*0.5f);

		switch (m_func)
		{
			case DERIVATE_DFDX:
				m_derivScale = 0.5f / dx;
				break;

			case DERIVATE_DFDY:
				m_derivScale = 0.5f / dy;
				break;

			case DERIVATE_FWIDTH:
				m_derivScale = 0.5f / (tcu::abs(dx) + tcu::abs(dy));
				break;

			default:
				DE_ASSERT(false);
		}

		m_derivBias = tcu::Vec4(0.0f, 0.0f, 0.0f, 0.0f);
	}
}